

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

void recall_tree_ns::init_tree(recall_tree *b)

{
  uint32_t routers_used;
  node local_68;
  
  routers_used = 0;
  local_68.parent = 0;
  local_68.recall_lbest = 0.0;
  local_68.internal = false;
  local_68.depth = 0;
  local_68.base_router = 0;
  local_68.left = 0;
  local_68.right = 0;
  local_68.n = 0.0;
  local_68.entropy = 0.0;
  local_68.passes = 1.0;
  local_68.preds._begin = (node_pred *)0x0;
  local_68.preds._end = (node_pred *)0x0;
  local_68.preds.end_array = (node_pred *)0x0;
  local_68.preds.erase_count = 0;
  v_array<recall_tree_ns::node>::push_back(&b->nodes,&local_68);
  init_tree(b,0,1,&routers_used);
  b->max_routers = (ulong)routers_used;
  return;
}

Assistant:

void init_tree(recall_tree& b)
{
  uint32_t routers_used = 0;

  b.nodes.push_back(node());
  init_tree(b, 0, 1, routers_used);
  b.max_routers = routers_used;
}